

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

void player_take_terrain_damage(player *p,loc grid)

{
  _Bool _Var1;
  wchar_t dam;
  wchar_t dam_00;
  feature *pfVar2;
  char local_48 [8];
  char dam_text [32];
  wchar_t dam_reduced;
  wchar_t dam_taken;
  player *p_local;
  loc grid_local;
  
  dam = player_check_terrain_damage(p,grid,true);
  if (dam != L'\0') {
    dam_00 = player_apply_damage_reduction(p,dam);
    _Var1 = square_isfiery((chunk *)cave,(loc_conflict)grid);
    if (_Var1) {
      memset(local_48,0,0x20);
      if ((L'\0' < dam_00) && (((p->opts).opt[3] & 1U) != 0)) {
        strnfmt(local_48,0x20," (%d)",(ulong)(uint)dam_00);
      }
      pfVar2 = square_feat((chunk *)cave,(loc_conflict)grid);
      msg("%s%s",pfVar2->hurt_msg,local_48);
      inven_damage(p,L'\x02',dam);
    }
    pfVar2 = square_feat((chunk *)cave,(loc_conflict)grid);
    take_hit(p,dam_00,pfVar2->die_msg);
  }
  return;
}

Assistant:

void player_take_terrain_damage(struct player *p, struct loc grid)
{
	int dam_taken = player_check_terrain_damage(p, grid, true);
	int dam_reduced;

	if (!dam_taken) {
		return;
	}

	/*
	 * Damage the player and inventory; inventory damage is based on
	 * the raw incoming damage and not the value accounting for the
	 * player's damage reduction.
	 */
	dam_reduced = player_apply_damage_reduction(p, dam_taken);
	if (square_isfiery(cave, grid)) {
		char dam_text[32] = "";

		if (dam_reduced > 0 && OPT(p, show_damage)) {
			strnfmt(dam_text, sizeof(dam_text), " (%d)",
				dam_reduced);
		}
		msg("%s%s", square_feat(cave, grid)->hurt_msg, dam_text);
		inven_damage(p, PROJ_FIRE, dam_taken);
	}
	take_hit(p, dam_reduced, square_feat(cave, grid)->die_msg);
}